

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  long __n;
  istream *piVar1;
  reference __dest;
  ostream *poVar2;
  void *pvVar3;
  ulong uVar4;
  ostream local_378 [8];
  ofstream f;
  ulong pts;
  long local_158;
  long THRESHOLD;
  long i_1;
  ulong best_pts;
  Sol best_sol;
  Sol sol;
  long len;
  pt end;
  pt start;
  long e_time;
  long s_time;
  long yend;
  long xend;
  long ystart;
  long xstart;
  long i;
  allocator<ride> local_59;
  undefined1 local_58 [8];
  vector<ride,_std::allocator<ride>_> rides;
  long steps;
  long bonus;
  long nrides;
  long vehs;
  long cols;
  long rows;
  
  rows._4_4_ = 0;
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&cols);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&vehs);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&nrides);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&bonus);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&steps);
  std::istream::operator>>
            (piVar1,(long *)&rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
  __n = bonus;
  std::allocator<ride>::allocator(&local_59);
  std::vector<ride,_std::allocator<ride>_>::vector
            ((vector<ride,_std::allocator<ride>_> *)local_58,__n,&local_59);
  std::allocator<ride>::~allocator(&local_59);
  for (xstart = 0; xstart < bonus; xstart = xstart + 1) {
    piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&ystart);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&xend);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&yend);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&s_time);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&e_time);
    std::istream::operator>>(piVar1,&start.y);
    end.y = ystart;
    start.x = xend;
    len = yend;
    end.x = s_time;
    dist((pt *)&end.y,(pt *)&len);
    sol.
    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)xstart;
    __dest = std::vector<ride,_std::allocator<ride>_>::operator[]
                       ((vector<ride,_std::allocator<ride>_> *)local_58,xstart);
    memcpy(__dest,&sol.
                   super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0x40);
  }
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector((vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
            *)&best_sol.
               super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector((vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
            *)&best_pts);
  i_1 = 0;
  for (THRESHOLD = 0; THRESHOLD < 0x1e; THRESHOLD = THRESHOLD + 1) {
    local_158 = THRESHOLD;
    poVar2 = std::operator<<((ostream *)&std::cerr,"iteration: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,THRESHOLD);
    poVar2 = std::operator<<(poVar2,", threshold: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,local_158);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    earliestStart((Sol *)&pts,(vector<ride,_std::allocator<ride>_> *)local_58,nrides,
                  (long)rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,local_158,cols,vehs);
    this = &best_sol.
            super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ::operator=((vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                 *)this,(vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                         *)&pts);
    std::
    vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ::~vector((vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
               *)&pts);
    uVar4 = simulate((Sol *)this,steps,
                     (long)rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    if ((ulong)i_1 < uVar4) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Improved: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,i_1);
      poVar2 = std::operator<<(poVar2,"->");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,uVar4);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      i_1 = uVar4;
      std::
      vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
      ::operator=((vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                   *)&best_pts,
                  (vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                   *)&best_sol.
                      super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ofstream::ofstream(local_378);
      poVar2 = std::operator<<((ostream *)&std::cerr,"Writing to file");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::ofstream::open(local_378,"/tmp/res.txt",0x10);
      print_assignments((Sol *)&best_pts,local_378);
      std::ofstream::close();
      std::ofstream::~ofstream(local_378);
    }
  }
  print_assignments((Sol *)&best_pts,(ostream *)&std::cout);
  rows._4_4_ = 0;
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::~vector((vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
             *)&best_pts);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::~vector((vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
             *)&best_sol.
                super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<ride,_std::allocator<ride>_>::~vector((vector<ride,_std::allocator<ride>_> *)local_58)
  ;
  return rows._4_4_;
}

Assistant:

int main() {
    long rows, cols, vehs, nrides, bonus, steps;
    cin >> rows >> cols >> vehs >> nrides >> bonus >> steps;

    vector<ride> rides(nrides);
    for (long i = 0; i < nrides; i++) {
        long xstart, ystart, xend, yend, s_time, e_time;
        cin >> xstart >> ystart >> xend >> yend >> s_time >> e_time;
        pt start{xstart, ystart};
        pt end{xend, yend};
        long len = dist(start, end);
        rides[i] = ride {i, s_time, e_time, len, start, end};
    }



    Sol sol;
//    if (nrides == 3 && vehs == 2 && rows == 3 && cols == 4) {
//        sol = exampleA(rides, vehs);
//    } else if (rows == 800 && cols == 1000 && bonus == 25 && steps == 25000) {
        // TODO: ex B
//    }

    Sol best_sol;
    ulong best_pts = 0;
    for (long i = 0; i < 30; i++) {
//        long THRESHOLD = 9 + (rand() % static_cast<int>(16 - 9 + 1));
        long THRESHOLD = i;
        cerr << "iteration: " << i << ", threshold: " << THRESHOLD << endl;
        sol = earliestStart(rides, vehs, steps, THRESHOLD, rows, cols);
        ulong pts = simulate(sol, bonus, steps); // print points
        if (pts > best_pts) {
            cerr << "Improved: " << best_pts << "->" << pts << endl;
            best_pts = pts;
            best_sol = sol;

            ofstream f;
            cerr << "Writing to file" << endl;
            f.open("/tmp/res.txt");
            print_assignments(best_sol, f);
            f.close();
        }
    }

    print_assignments(best_sol, cout);

    return 0;
}